

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::IteratorSymbol::IteratorSymbol
          (IteratorSymbol *this,string_view name,SourceLocation loc,Type *arrayType,Type *indexType)

{
  string_view name_00;
  TempVarSymbol *in_RDX;
  undefined8 in_RSI;
  Type *in_RDI;
  Type *in_R8;
  SourceLocation in_R9;
  ValueSymbol *in_stack_ffffffffffffffb0;
  
  name_00._M_str = (char *)in_RDI;
  name_00._M_len = (size_t)in_R8;
  TempVarSymbol::TempVarSymbol
            (in_RDX,(SymbolKind)((ulong)in_RSI >> 0x20),name_00,in_R9,(VariableLifetime)in_RSI);
  in_RDI[4].canonical = in_R8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 5));
  bitmask<slang::ast::VariableFlags>::bitmask
            ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffb6,Const);
  bitmask<slang::ast::VariableFlags>::operator|=
            ((bitmask<slang::ast::VariableFlags> *)&in_RDI[4].super_Symbol.field_0x34,
             (bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffb6);
  ValueSymbol::setType(in_stack_ffffffffffffffb0,in_RDI);
  return;
}

Assistant:

IteratorSymbol::IteratorSymbol(std::string_view name, SourceLocation loc, const Type& arrayType,
                               const Type& indexType) :
    TempVarSymbol(SymbolKind::Iterator, name, loc, VariableLifetime::Automatic),
    arrayType(arrayType) {

    flags |= VariableFlags::Const;
    setType(indexType);
}